

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_infer_nedge_nface(REF_GRID ref_grid)

{
  REF_GEOM pRVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  REF_INT min_id;
  REF_INT max_id;
  int local_20;
  REF_INT local_1c;
  
  pRVar1 = ref_grid->geom;
  uVar2 = ref_cell_id_range(ref_grid->cell[3],ref_grid->mpi,&local_20,&local_1c);
  if (uVar2 == 0) {
    lVar3 = (long)local_20;
    if (lVar3 == 1) {
      pRVar1->nface = local_1c;
      uVar2 = ref_cell_id_range(ref_grid->cell[0],ref_grid->mpi,&local_20,&local_1c);
      if (uVar2 != 0) {
        pcVar5 = "edge range";
        uVar4 = 0x9a6;
        goto LAB_001534d7;
      }
      lVar3 = (long)local_20;
      if (lVar3 == 1) {
        pRVar1->nedge = local_1c;
        return 0;
      }
      pcVar5 = "first edge id not 1";
      uVar4 = 0x9a7;
    }
    else {
      pcVar5 = "first face id not 1";
      uVar4 = 0x9a2;
    }
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar4,
           "ref_geom_infer_nedge_nface",pcVar5,1,lVar3);
    uVar2 = 1;
  }
  else {
    pcVar5 = "face range";
    uVar4 = 0x9a1;
LAB_001534d7:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar4,
           "ref_geom_infer_nedge_nface",(ulong)uVar2,pcVar5);
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_infer_nedge_nface(REF_GRID ref_grid) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT min_id, max_id;
  RSS(ref_cell_id_range(ref_grid_tri(ref_grid), ref_grid_mpi(ref_grid), &min_id,
                        &max_id),
      "face range");
  REIS(1, min_id, "first face id not 1");
  ref_geom->nface = max_id;
  RSS(ref_cell_id_range(ref_grid_edg(ref_grid), ref_grid_mpi(ref_grid), &min_id,
                        &max_id),
      "edge range");
  REIS(1, min_id, "first edge id not 1");
  ref_geom->nedge = max_id;
  return REF_SUCCESS;
}